

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O1

void sdefl_huff(uchar *lens,uint *codes,uint *freqs,uint num_syms,uint max_code_len)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint len_cnt [16];
  int local_4f8 [16];
  uint local_4b8 [290];
  
  uVar17 = (ulong)num_syms;
  uVar18 = 0;
  memset(local_4b8,0,0x480);
  uVar4 = num_syms + 3 & 0xfffffffc;
  if (num_syms != 0) {
    uVar9 = 0;
    do {
      uVar13 = freqs[uVar9];
      if (uVar4 - 1 <= freqs[uVar9]) {
        uVar13 = uVar4 - 1;
      }
      local_4b8[uVar13] = local_4b8[uVar13] + 1;
      uVar9 = uVar9 + 1;
    } while (uVar17 != uVar9);
  }
  if (uVar4 != 0) {
    uVar9 = 1;
    uVar13 = 0;
    do {
      uVar18 = local_4b8[uVar9] + uVar13;
      local_4b8[uVar9] = uVar13;
      uVar9 = uVar9 + 1;
      uVar13 = uVar18;
    } while (uVar4 != uVar9);
  }
  if (num_syms != 0) {
    uVar9 = 0;
    do {
      uVar13 = freqs[uVar9];
      if (uVar13 == 0) {
        lens[uVar9] = '\0';
      }
      else {
        uVar10 = uVar4 - 1;
        if (uVar13 < uVar4 - 1) {
          uVar10 = uVar13;
        }
        uVar12 = local_4b8[uVar10];
        local_4b8[uVar10] = uVar12 + 1;
        codes[uVar12] = (uint)uVar9 | uVar13 << 10;
      }
      uVar9 = uVar9 + 1;
    } while (uVar17 != uVar9);
  }
  uVar13 = local_4b8[uVar4 - 2];
  uVar4 = local_4b8[uVar4 - 1] - uVar13;
  if (1 < uVar4) {
    uVar10 = uVar4 >> 1;
    do {
      uVar12 = codes[(ulong)uVar13 + ((ulong)uVar10 - 1)];
      uVar16 = uVar10 * 2;
      uVar11 = uVar10;
      if (uVar16 <= uVar4) {
        uVar9 = (ulong)uVar10;
        do {
          if ((uVar4 <= uVar16) ||
             (uVar6 = (ulong)(uVar16 | 1),
             codes[(ulong)uVar13 + ((ulong)(uVar16 | 1) - 1)] <=
             codes[(ulong)uVar13 + ((ulong)uVar16 - 1)])) {
            uVar6 = (ulong)uVar16;
          }
          uVar11 = (uint)uVar6;
          if (codes[(ulong)uVar13 + (uVar6 - 1)] <= uVar12) {
            uVar11 = (uint)uVar9;
            break;
          }
          codes[(ulong)uVar13 + (uVar9 - 1)] = codes[(ulong)uVar13 + (uVar6 - 1)];
          uVar16 = uVar11 * 2;
          uVar9 = uVar6;
        } while (uVar16 <= uVar4);
      }
      codes[(ulong)uVar13 + ((ulong)uVar11 - 1)] = uVar12;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  if (1 < uVar4) {
    puVar1 = codes + uVar13;
    uVar9 = (ulong)uVar4;
    do {
      uVar4 = puVar1[uVar9 - 1];
      puVar1[uVar9 - 1] = *puVar1;
      *puVar1 = uVar4;
      uVar10 = (uint)(uVar9 - 1);
      uVar6 = 1;
      if (uVar9 != 2) {
        uVar15 = 2;
        uVar6 = 1;
        do {
          if ((uVar10 <= (uint)uVar15) ||
             (uVar14 = (ulong)((uint)uVar15 | 1),
             codes[(ulong)uVar13 + (uVar14 - 1)] <= codes[(ulong)uVar13 + (uVar15 - 1)])) {
            uVar14 = uVar15;
          }
          if (codes[(ulong)uVar13 + (uVar14 - 1)] <= uVar4) break;
          codes[(ulong)uVar13 + (uVar6 - 1)] = codes[(ulong)uVar13 + (uVar14 - 1)];
          uVar12 = (int)uVar14 * 2;
          uVar15 = (ulong)uVar12;
          uVar6 = uVar14;
        } while (uVar12 <= uVar10);
      }
      codes[(ulong)uVar13 + (uVar6 - 1)] = uVar4;
      uVar9 = uVar9 - 1;
    } while (1 < uVar10);
  }
  if (uVar18 != 0) {
    if (uVar18 == 1) {
      uVar4 = (*codes & 0x3ff) + (uint)((*codes & 0x3ff) == 0);
      *codes = 0;
      *lens = '\x01';
      codes[uVar4] = 1;
      lens[uVar4] = '\x01';
    }
    else {
      iVar5 = 0;
      uVar9 = 0;
      uVar10 = 0;
      uVar13 = 0;
      uVar4 = uVar18;
      do {
        if ((uVar13 == uVar18) || ((uVar9 != uVar10 && (codes[uVar10] >> 10 < codes[uVar13] >> 10)))
           ) {
          uVar12 = uVar13;
          uVar16 = uVar10 + 1;
          uVar11 = uVar10;
        }
        else {
          uVar12 = uVar13 + 1;
          uVar16 = uVar10;
          uVar11 = uVar13;
        }
        if ((uVar12 == uVar18) || ((uVar9 != uVar16 && (codes[uVar16] >> 10 < codes[uVar12] >> 10)))
           ) {
          uVar13 = uVar12;
          uVar12 = uVar16;
          uVar10 = uVar16 + 1;
        }
        else {
          uVar13 = uVar12 + 1;
          uVar10 = uVar16;
        }
        uVar16 = codes[uVar11];
        uVar2 = codes[uVar12];
        codes[uVar11] = (uVar16 & 0x3ff) + iVar5;
        codes[uVar12] = (codes[uVar12] & 0x3ff) + iVar5;
        codes[uVar9] = codes[uVar9] & 0x3ff | (uVar2 & 0xfffffc00) + (uVar16 & 0xfffffc00);
        uVar9 = uVar9 + 1;
        uVar4 = uVar4 - 1;
        iVar5 = iVar5 + 0x400;
      } while (1 < uVar4);
      uVar18 = uVar18 - 2;
      uVar9 = (ulong)max_code_len;
      memset(local_4f8,0,uVar9 * 4 + 4);
      local_4f8[1] = 2;
      codes[uVar18] = codes[uVar18] & 0x3ff;
      uVar6 = (ulong)uVar18;
      if (0 < (int)uVar18) {
        do {
          uVar4 = (codes[codes[uVar6 - 1] >> 10] >> 10) + 1;
          uVar15 = (ulong)uVar4;
          codes[uVar6 - 1] = uVar4 * 0x400 | codes[uVar6 - 1] & 0x3ff;
          if (max_code_len <= uVar4) {
            uVar15 = (ulong)max_code_len;
            do {
              uVar15 = (ulong)((int)uVar15 - 1);
            } while (local_4f8[uVar15] == 0);
          }
          local_4f8[uVar15] = local_4f8[uVar15] + -1;
          local_4f8[(int)uVar15 + 1] = local_4f8[(int)uVar15 + 1] + 2;
          bVar3 = 1 < (long)uVar6;
          uVar6 = uVar6 - 1;
        } while (bVar3);
      }
      if (max_code_len != 0) {
        uVar6 = 0;
        do {
          for (iVar5 = local_4f8[uVar9]; iVar5 != 0; iVar5 = iVar5 + -1) {
            lens[codes[uVar6] & 0x3ff] = (uchar)uVar9;
            uVar6 = (ulong)((int)uVar6 + 1);
          }
          uVar9 = uVar9 - 1;
        } while ((int)uVar9 != 0);
      }
      local_4b8[0] = 0;
      local_4b8[1] = 0;
      if (1 < max_code_len) {
        local_4b8[1] = 0;
        lVar8 = 0;
        do {
          local_4b8[1] = (local_4b8[1] + local_4f8[lVar8 + 1]) * 2;
          local_4b8[lVar8 + 2] = local_4b8[1];
          lVar8 = lVar8 + 1;
        } while ((ulong)(max_code_len + 1) - 2 != lVar8);
      }
      if (num_syms != 0) {
        uVar9 = 0;
        do {
          uVar4 = local_4b8[lens[uVar9]];
          local_4b8[lens[uVar9]] = uVar4 + 1;
          codes[uVar9] = uVar4;
          uVar9 = uVar9 + 1;
        } while (uVar17 != uVar9);
      }
      if (num_syms != 0) {
        uVar9 = 0;
        do {
          uVar7 = (ushort)codes[uVar9] << 8 | (ushort)codes[uVar9] >> 8;
          uVar4 = (uVar7 & 0xf0f) << 4 | uVar7 >> 4 & 0xf0f;
          uVar4 = (uVar4 >> 2 & 0x3333) + (uVar4 & 0x3333) * 4;
          codes[uVar9] = (uVar4 >> 1 & 0x5555) + (uVar4 & 0x5555) * 2 >> (0x10 - lens[uVar9] & 0x1f)
          ;
          uVar9 = uVar9 + 1;
        } while (uVar17 != uVar9);
      }
    }
  }
  return;
}

Assistant:

static void
sdefl_huff(unsigned char *lens, unsigned *codes, unsigned *freqs,
           unsigned num_syms, unsigned max_code_len) {
  unsigned c, *A = codes;
  unsigned len_cnt[SDEFL_MAX_CODE_LEN + 1];
  unsigned used_syms = sdefl_sort_sym(num_syms, freqs, lens, A);
  if (!used_syms) return;
  if (used_syms == 1) {
    unsigned s = A[0] & SDEFL_SYM_MSK;
    unsigned i = s ? s : 1;
    codes[0] = 0, lens[0] = 1;
    codes[i] = 1, lens[i] = 1;
    return;
  }
  sdefl_build_tree(A, used_syms);
  sdefl_gen_len_cnt(A, used_syms-2, len_cnt, max_code_len);
  sdefl_gen_codes(A, lens, len_cnt, max_code_len, num_syms);
  for (c = 0; c < num_syms; c++) {
    codes[c] = sdefl_rev(codes[c], lens[c]);
  }
}